

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform.h
# Opt level: O2

void ncnn::conv3x3s1_winograd63_transform_output_sse
               (Mat *top_blob_tm,Mat *top_blob,Mat *bias,Option *opt)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  int j;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  void *pvVar23;
  void *pvVar24;
  long lVar25;
  float *pfVar26;
  void *pvVar27;
  void *pvVar28;
  void *pvVar29;
  void *pvVar30;
  uint uVar31;
  long lVar32;
  float *pfVar33;
  float *pfVar34;
  void *pvVar35;
  void *pvVar36;
  void *pvVar37;
  void *pvVar38;
  long lVar39;
  void *pvVar40;
  void *pvVar41;
  void *pvVar42;
  void *pvVar43;
  long lVar44;
  ulong uVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float tmp [6] [8];
  float *local_1d0;
  void *local_1c8;
  void *local_1c0;
  void *local_1b8;
  void *local_1b0;
  void *local_1a8;
  void *local_1a0;
  void *local_198;
  void *local_190;
  void *local_188;
  float afStack_f8 [3];
  ulong auStack_ec [2];
  float afStack_dc [43];
  
  iVar1 = top_blob->w;
  uVar31 = iVar1 / 6;
  uVar16 = (long)top_blob->h / 6;
  iVar15 = (int)uVar16;
  iVar18 = iVar15 * uVar31;
  pvVar2 = bias->data;
  sVar3 = top_blob->elemsize;
  uVar45 = 0;
  if (0 < (int)uVar31) {
    uVar45 = (ulong)uVar31;
  }
  uVar16 = uVar16 & 0xffffffff;
  if (iVar15 < 1) {
    uVar16 = 0;
  }
  uVar22 = (ulong)(uint)top_blob->c;
  if (top_blob->c < 1) {
    uVar22 = 0;
  }
  lVar39 = top_blob_tm->cstep * top_blob_tm->elemsize;
  local_190 = top_blob_tm->data;
  sVar4 = top_blob->cstep;
  local_198 = (void *)((long)local_190 + (long)(iVar18 * 7) * 4);
  lVar32 = (long)(int)uVar31 * 4;
  local_1a0 = (void *)((long)local_190 + (long)(iVar18 * 6) * 4);
  local_1a8 = (void *)((long)local_190 + (long)(iVar18 * 5) * 4);
  local_1b0 = (void *)((long)local_190 + (long)(iVar18 * 4) * 4);
  local_1b8 = (void *)((long)local_190 + (long)(iVar18 * 3) * 4);
  local_1c0 = (void *)((long)local_190 + (long)(iVar18 * 2) * 4);
  local_1c8 = (void *)((long)local_190 + (long)iVar18 * 4);
  local_1d0 = (float *)((long)top_blob->data + 0x14);
  for (uVar21 = 0; uVar21 != uVar22; uVar21 = uVar21 + 1) {
    if (pvVar2 == (void *)0x0) {
      fVar46 = 0.0;
    }
    else {
      fVar46 = *(float *)((long)pvVar2 + uVar21 * 4);
    }
    local_188 = local_198;
    pvVar24 = local_1a8;
    pvVar28 = local_1c0;
    pvVar30 = local_1c8;
    pfVar34 = local_1d0;
    pvVar36 = local_1b8;
    pvVar38 = local_1b0;
    pvVar41 = local_190;
    pvVar43 = local_1a0;
    for (uVar20 = 0; uVar20 != uVar16; uVar20 = uVar20 + 1) {
      pvVar19 = pvVar36;
      pvVar23 = pvVar24;
      pvVar27 = pvVar28;
      pvVar29 = pvVar30;
      pfVar33 = pfVar34;
      pvVar35 = pvVar43;
      pvVar37 = pvVar38;
      pvVar40 = pvVar41;
      pvVar42 = local_188;
      for (uVar17 = 0; uVar17 != uVar45; uVar17 = uVar17 + 1) {
        lVar44 = 0;
        for (lVar25 = -0x20; lVar25 != 0; lVar25 = lVar25 + 4) {
          fVar5 = *(float *)((long)pvVar27 + lVar44) + *(float *)((long)pvVar29 + lVar44);
          fVar12 = *(float *)((long)pvVar29 + lVar44) - *(float *)((long)pvVar27 + lVar44);
          fVar6 = *(float *)((long)pvVar37 + lVar44) + *(float *)((long)pvVar19 + lVar44);
          fVar13 = *(float *)((long)pvVar19 + lVar44) - *(float *)((long)pvVar37 + lVar44);
          fVar7 = *(float *)((long)pvVar35 + lVar44) + *(float *)((long)pvVar23 + lVar44);
          fVar14 = *(float *)((long)pvVar23 + lVar44) - *(float *)((long)pvVar35 + lVar44);
          *(float *)((long)afStack_dc + lVar25 + 4) =
               fVar6 + fVar5 + *(float *)((long)pvVar40 + lVar44) + fVar7 * 32.0;
          *(float *)((long)afStack_dc + lVar25 + 0x44) = fVar6 * 4.0 + fVar5 + fVar7 * 8.0;
          *(float *)((long)afStack_dc + lVar25 + 0x84) = fVar6 * 16.0 + fVar5 + fVar7 + fVar7;
          *(float *)((long)afStack_dc + lVar25 + 0x24) = fVar13 + fVar13 + fVar12 + fVar14 * 16.0;
          *(float *)((long)afStack_dc + lVar25 + 100) = fVar13 * 8.0 + fVar12 + fVar14 * 4.0;
          *(float *)((long)afStack_dc + lVar25 + 0xa4) =
               fVar13 * 32.0 + fVar14 + fVar12 + *(float *)((long)pvVar42 + lVar44);
          lVar44 = lVar44 + (long)(iVar18 * 8) * 4;
        }
        pfVar26 = pfVar33;
        for (lVar25 = 0; lVar25 != 0xc0; lVar25 = lVar25 + 0x20) {
          fVar5 = *(float *)((long)afStack_f8 + lVar25 + 4);
          fVar6 = *(float *)((long)afStack_f8 + lVar25 + 8);
          fVar7 = fVar6 + fVar5 + fVar46;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = *(ulong *)((long)auStack_ec + lVar25);
          auVar8 = vhaddps_avx(auVar47,auVar47);
          fVar5 = (fVar5 - fVar6) + fVar46;
          auVar10 = vshufps_avx(auVar47,auVar47,0xe1);
          auVar11 = vsubps_avx(auVar10,auVar47);
          auVar10 = vblendps_avx(auVar8,auVar11,2);
          auVar48._8_8_ = 0;
          auVar48._0_8_ = *(ulong *)((long)auStack_ec + lVar25 + 8);
          auVar9 = vhaddps_avx(auVar48,auVar48);
          auVar47 = vshufps_avx(auVar48,auVar48,0xe1);
          auVar48 = vsubps_avx(auVar47,auVar48);
          auVar47 = vblendps_avx(auVar9,auVar48,2);
          uVar31 = *(uint *)((long)afStack_f8 + lVar25);
          pfVar26[-1] = auVar8._0_4_ * 16.0 + fVar7 + auVar9._0_4_ + auVar9._0_4_;
          auVar9 = vinsertps_avx(ZEXT416(uVar31),ZEXT416((uint)fVar5),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)fVar7),0x20);
          auVar9 = vshufps_avx(auVar9,auVar9,100);
          pfVar26[-5] = auVar8._0_4_ + fVar7 + auVar9._0_4_ + auVar47._0_4_ * 32.0;
          pfVar26[-4] = auVar10._4_4_ * 2.0 + auVar9._4_4_ + auVar47._4_4_ * 16.0;
          pfVar26[-3] = auVar10._0_4_ * 0.0 + auVar9._8_4_ + auVar47._0_4_ * 8.0;
          pfVar26[-2] = auVar10._4_4_ * 8.0 + auVar9._12_4_ + auVar47._4_4_ * 4.0;
          auVar10 = vmovshdup_avx(auVar11);
          auVar47 = vmovshdup_avx(auVar48);
          *pfVar26 = auVar10._0_4_ * 32.0 + auVar47._0_4_ + fVar5 +
                     *(float *)((long)afStack_dc + lVar25);
          pfVar26 = pfVar26 + iVar1;
        }
        pvVar42 = (void *)((long)pvVar42 + 4);
        pvVar35 = (void *)((long)pvVar35 + 4);
        pvVar23 = (void *)((long)pvVar23 + 4);
        pvVar37 = (void *)((long)pvVar37 + 4);
        pvVar19 = (void *)((long)pvVar19 + 4);
        pvVar27 = (void *)((long)pvVar27 + 4);
        pvVar29 = (void *)((long)pvVar29 + 4);
        pvVar40 = (void *)((long)pvVar40 + 4);
        pfVar33 = pfVar33 + 6;
      }
      local_188 = (void *)((long)local_188 + lVar32);
      pvVar43 = (void *)((long)pvVar43 + lVar32);
      pvVar24 = (void *)((long)pvVar24 + lVar32);
      pvVar38 = (void *)((long)pvVar38 + lVar32);
      pvVar36 = (void *)((long)pvVar36 + lVar32);
      pvVar28 = (void *)((long)pvVar28 + lVar32);
      pvVar30 = (void *)((long)pvVar30 + lVar32);
      pvVar41 = (void *)((long)pvVar41 + lVar32);
      pfVar34 = (float *)((long)pfVar34 + sVar3 * (long)iVar1 * 6);
    }
    local_198 = (void *)((long)local_198 + lVar39);
    local_1a0 = (void *)((long)local_1a0 + lVar39);
    local_1a8 = (void *)((long)local_1a8 + lVar39);
    local_1b0 = (void *)((long)local_1b0 + lVar39);
    local_1b8 = (void *)((long)local_1b8 + lVar39);
    local_1c0 = (void *)((long)local_1c0 + lVar39);
    local_1c8 = (void *)((long)local_1c8 + lVar39);
    local_190 = (void *)((long)local_190 + lVar39);
    local_1d0 = (float *)((long)local_1d0 + sVar3 * sVar4);
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_output_sse(const Mat& top_blob_tm, Mat& top_blob, const Mat& bias, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int w_tiles = outw / 6;
    const int h_tiles = outh / 6;
    const int tiles = w_tiles * h_tiles;

    const float* biasptr = bias;

    // const float otm[6][8] = {
    //     {1.0f,  1.0f,   1.0f,   1.0f,   1.0f,  32.0f, 32.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   2.0f,  -2.0f,  16.0f,-16.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,   4.0f,   4.0f,   8.0f,  8.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   8.0f,  -8.0f,   4.0f, -4.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,  16.0f,  16.0f,   2.0f,  2.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,  32.0f, -32.0f,   1.0f, -1.0f, 1.0f}
    // };

    // 0 = r0 + (r1 + r2) + (r3 + r4)     + (r5 + r6) * 32
    // 1 =      (r1 - r2) + (r3 - r4) * 2 + (r5 - r6) * 16
    // 2 =      (r1 + r2) + (r3 + r4) * 4 + (r5 + r6) * 8
    // 3 =      (r1 - r2) + (r3 - r4) * 8 + (r5 - r6) * 4
    // 4 =      (r1 + r2) + (r3 + r4) * 16+ (r5 + r6) * 2
    // 5 = r7 + (r1 - r2) + (r3 - r4) * 32+ (r5 - r6)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        const Mat out0_tm = top_blob_tm.channel(p);
        Mat out0 = top_blob.channel(p);

        const float bias0 = biasptr ? biasptr[p] : 0.f;

        float tmp[6][8];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* output0_tm_0 = (const float*)out0_tm + (i * w_tiles + j) * 1;
                const float* output0_tm_1 = output0_tm_0 + tiles * 1;
                const float* output0_tm_2 = output0_tm_0 + tiles * 2;
                const float* output0_tm_3 = output0_tm_0 + tiles * 3;
                const float* output0_tm_4 = output0_tm_0 + tiles * 4;
                const float* output0_tm_5 = output0_tm_0 + tiles * 5;
                const float* output0_tm_6 = output0_tm_0 + tiles * 6;
                const float* output0_tm_7 = output0_tm_0 + tiles * 7;

                // TODO sse optimize
                for (int m = 0; m < 8; m++)
                {
                    float tmp024a = output0_tm_1[0] + output0_tm_2[0];
                    float tmp135a = output0_tm_1[0] - output0_tm_2[0];

                    float tmp024b = output0_tm_3[0] + output0_tm_4[0];
                    float tmp135b = output0_tm_3[0] - output0_tm_4[0];

                    float tmp024c = output0_tm_5[0] + output0_tm_6[0];
                    float tmp135c = output0_tm_5[0] - output0_tm_6[0];

                    tmp[0][m] = output0_tm_0[0] + tmp024a + tmp024b + tmp024c * 32;
                    tmp[2][m] = tmp024a + tmp024b * 4 + tmp024c * 8;
                    tmp[4][m] = tmp024a + tmp024b * 16 + tmp024c + tmp024c;

                    tmp[1][m] = tmp135a + tmp135b + tmp135b + tmp135c * 16;
                    tmp[3][m] = tmp135a + tmp135b * 8 + tmp135c * 4;
                    tmp[5][m] = output0_tm_7[0] + tmp135a + tmp135b * 32 + tmp135c;

                    output0_tm_0 += tiles * 8;
                    output0_tm_1 += tiles * 8;
                    output0_tm_2 += tiles * 8;
                    output0_tm_3 += tiles * 8;
                    output0_tm_4 += tiles * 8;
                    output0_tm_5 += tiles * 8;
                    output0_tm_6 += tiles * 8;
                    output0_tm_7 += tiles * 8;
                }

                float* output0 = out0.row(i * 6) + j * 6;

                for (int m = 0; m < 6; m++)
                {
                    const float* tmp0 = tmp[m];

                    float tmp024a = tmp0[1] + tmp0[2];
                    float tmp135a = tmp0[1] - tmp0[2];

                    float tmp024b = tmp0[3] + tmp0[4];
                    float tmp135b = tmp0[3] - tmp0[4];

                    float tmp024c = tmp0[5] + tmp0[6];
                    float tmp135c = tmp0[5] - tmp0[6];

                    output0[0] = bias0 + tmp0[0] + tmp024a + tmp024b + tmp024c * 32;
                    output0[2] = bias0 + tmp024a + tmp024b * 4 + tmp024c * 8;
                    output0[4] = bias0 + tmp024a + tmp024b * 16 + tmp024c + tmp024c;

                    output0[1] = bias0 + tmp135a + tmp135b + tmp135b + tmp135c * 16;
                    output0[3] = bias0 + tmp135a + tmp135b * 8 + tmp135c * 4;
                    output0[5] = bias0 + tmp0[7] + tmp135a + tmp135b * 32 + tmp135c;

                    output0 += outw;
                }
            }
        }
    }
}